

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O0

uint alloc_channel_id_general(tree234 *channels,size_t localid_offset)

{
  undefined1 auStack_48 [4];
  uint localid;
  search234_state ss;
  uint CHANNEL_NUMBER_OFFSET;
  size_t localid_offset_local;
  tree234 *channels_local;
  
  ss._node._4_4_ = 0x100;
  search234_start((search234_state *)auStack_48,channels);
  while (_auStack_48 != (void *)0x0) {
    if (*(int *)((long)_auStack_48 + localid_offset) == (int)ss.element + 0x100) {
      search234_step((search234_state *)auStack_48,1);
    }
    else {
      search234_step((search234_state *)auStack_48,-1);
    }
  }
  return (int)ss.element + 0x100;
}

Assistant:

unsigned alloc_channel_id_general(tree234 *channels, size_t localid_offset)
{
    const unsigned CHANNEL_NUMBER_OFFSET = 256;
    search234_state ss;

    /*
     * First-fit allocation of channel numbers: we always pick the
     * lowest unused one.
     *
     * Every channel before that, and no channel after it, has an ID
     * exactly equal to its tree index plus CHANNEL_NUMBER_OFFSET. So
     * we can use the search234 system to identify the length of that
     * initial sequence, in a single log-time pass down the channels
     * tree.
     */
    search234_start(&ss, channels);
    while (ss.element) {
        unsigned localid = *(unsigned *)((char *)ss.element + localid_offset);
        if (localid == ss.index + CHANNEL_NUMBER_OFFSET)
            search234_step(&ss, +1);
        else
            search234_step(&ss, -1);
    }

    /*
     * Now ss.index gives exactly the number of channels in that
     * initial sequence. So adding CHANNEL_NUMBER_OFFSET to it must
     * give precisely the lowest unused channel number.
     */
    return ss.index + CHANNEL_NUMBER_OFFSET;
}